

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O3

void __thiscall
Function_Pool::FunctionPoolTask::_setup
          (FunctionPoolTask *this,Image *in,uint32_t startXIn,uint32_t startYIn,uint32_t widthIn,
          uint32_t heightIn,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t widthOut,
          uint32_t heightOut)

{
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
  *this_00;
  unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
  *this_01;
  InputImageInfo *__ptr;
  OutputImageInfo *__ptr_00;
  uint32_t width_;
  bool bVar1;
  uint32_t count;
  uint32_t uVar2;
  InputImageInfo *this_02;
  _Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false> this_03;
  imageException *this_04;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,widthIn,heightIn);
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (out,startXOut,startYOut,widthOut,heightOut);
  bVar1 = AbstractTaskProvider::_ready((AbstractTaskProvider *)this);
  if (bVar1) {
    this_02 = (InputImageInfo *)operator_new(0x68);
    count = anon_unknown.dwarf_52a2f::threadCount();
    uVar2 = heightIn;
    if (heightOut < heightIn) {
      uVar2 = heightOut;
    }
    width_ = widthIn;
    if (widthOut < widthIn) {
      width_ = widthOut;
    }
    AreaInfo::AreaInfo((AreaInfo *)this_02,startXIn,startYIn,width_,uVar2,count);
    this_00 = &this->_infoIn1;
    this_02->image = in;
    __ptr = (this->_infoIn1)._M_t.
            super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
            ._M_t.
            super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
            .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    (this->_infoIn1)._M_t.
    super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
    ._M_t.
    super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
    .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl = this_02;
    if (__ptr != (InputImageInfo *)0x0) {
      std::default_delete<Function_Pool::InputImageInfo>::operator()
                ((default_delete<Function_Pool::InputImageInfo> *)this_00,__ptr);
    }
    this_03._M_head_impl = (OutputImageInfo *)operator_new(0x68);
    uVar2 = anon_unknown.dwarf_52a2f::threadCount();
    AreaInfo::AreaInfo((AreaInfo *)this_03._M_head_impl,startXOut,startYOut,widthOut,heightOut,uVar2
                      );
    this_01 = &this->_infoOut;
    (this_03._M_head_impl)->image = out;
    __ptr_00 = (this->_infoOut)._M_t.
               super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
               .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    (this->_infoOut)._M_t.
    super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ._M_t.
    super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
    .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl =
         this_03._M_head_impl;
    if (__ptr_00 != (OutputImageInfo *)0x0) {
      std::default_delete<Function_Pool::OutputImageInfo>::operator()
                ((default_delete<Function_Pool::OutputImageInfo> *)this_01,__ptr_00);
      this_03._M_head_impl =
           (this_01->_M_t).
           super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
           .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    }
    AreaInfo::_copy(&(this_03._M_head_impl)->super_AreaInfo,
                    &((this_00->_M_t).
                      super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
                      .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl)->
                     super_AreaInfo,startXOut,startYOut,widthOut,heightOut);
    AreaInfo::_copy(&((this_00->_M_t).
                      super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
                      .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl)->
                     super_AreaInfo,
                    &((this_01->_M_t).
                      super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
                      .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl)
                     ->super_AreaInfo,startXIn,startYIn,widthIn,heightIn);
    return;
  }
  this_04 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_04,"FunctionTask object was called multiple times!");
  __cxa_throw(this_04,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void FunctionPoolTask::_setup( const Image & in, uint32_t startXIn, uint32_t startYIn, uint32_t widthIn, uint32_t heightIn,
                                   Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t widthOut, uint32_t heightOut )
    {
        Image_Function::ParameterValidation( in, startXIn, startYIn, widthIn, heightIn );
        Image_Function::ParameterValidation( out, startXOut, startYOut, widthOut, heightOut );

        if( !_ready() )
            throw imageException( "FunctionTask object was called multiple times!" );

        _infoIn1 = std::unique_ptr < InputImageInfo  >( new InputImageInfo ( in, startXIn, startYIn, std::min( widthIn, widthOut ),
                                                                                                     std::min( heightIn, heightOut ), threadCount() ) );
        _infoOut = std::unique_ptr < OutputImageInfo >( new OutputImageInfo( out, startXOut, startYOut, widthOut, heightOut, threadCount() ) );

        _infoOut->_copy( *_infoIn1, startXOut, startYOut, widthOut, heightOut );
        _infoIn1->_copy( *_infoOut, startXIn, startYIn, widthIn, heightIn );
    }